

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O3

void ImGui_ImplGlfw_CreateWindow(ImGuiViewport *viewport)

{
  undefined8 *puVar1;
  GLFWwindow *pGVar2;
  
  puVar1 = (undefined8 *)ImGui::MemAlloc(0x10);
  *puVar1 = 0;
  *(undefined1 *)(puVar1 + 1) = 0;
  *(undefined4 *)((long)puVar1 + 0xc) = 0xffffffff;
  viewport->PlatformUserData = puVar1;
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x20001,0);
  glfwWindowHint(0x2000c,0);
  glfwWindowHint(0x20005,~viewport->Flags & 1);
  glfwWindowHint(0x20007,(uint)viewport->Flags >> 6 & 1);
  pGVar2 = (GLFWwindow *)0x0;
  if (g_ClientApi == GlfwClientApi_OpenGL) {
    pGVar2 = g_Window;
  }
  pGVar2 = glfwCreateWindow((int)(viewport->Size).x,(int)(viewport->Size).y,"No Title Yet",
                            (GLFWmonitor *)0x0,pGVar2);
  *puVar1 = pGVar2;
  *(undefined1 *)(puVar1 + 1) = 1;
  viewport->PlatformHandle = pGVar2;
  glfwSetWindowPos(pGVar2,(int)(viewport->Pos).x,(int)(viewport->Pos).y);
  glfwSetMouseButtonCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_MouseButtonCallback);
  glfwSetScrollCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_ScrollCallback);
  glfwSetKeyCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_KeyCallback);
  glfwSetCharCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_CharCallback);
  glfwSetWindowCloseCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_WindowCloseCallback);
  glfwSetWindowPosCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_WindowPosCallback);
  glfwSetWindowSizeCallback((GLFWwindow *)*puVar1,ImGui_ImplGlfw_WindowSizeCallback);
  if (g_ClientApi == GlfwClientApi_OpenGL) {
    glfwMakeContextCurrent((GLFWwindow *)*puVar1);
    glfwSwapInterval(0);
    return;
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_CreateWindow(ImGuiViewport* viewport)
{
    ImGuiViewportDataGlfw* data = IM_NEW(ImGuiViewportDataGlfw)();
    viewport->PlatformUserData = data;

    // GLFW 3.2 unfortunately always set focus on glfwCreateWindow() if GLFW_VISIBLE is set, regardless of GLFW_FOCUSED
    // With GLFW 3.3, the hint GLFW_FOCUS_ON_SHOW fixes this problem
    glfwWindowHint(GLFW_VISIBLE, false);
    glfwWindowHint(GLFW_FOCUSED, false);
#if GLFW_HAS_FOCUS_ON_SHOW
     glfwWindowHint(GLFW_FOCUS_ON_SHOW, false);
 #endif
    glfwWindowHint(GLFW_DECORATED, (viewport->Flags & ImGuiViewportFlags_NoDecoration) ? false : true);
#if GLFW_HAS_WINDOW_TOPMOST
    glfwWindowHint(GLFW_FLOATING, (viewport->Flags & ImGuiViewportFlags_TopMost) ? true : false);
#endif
    GLFWwindow* share_window = (g_ClientApi == GlfwClientApi_OpenGL) ? g_Window : NULL;
    data->Window = glfwCreateWindow((int)viewport->Size.x, (int)viewport->Size.y, "No Title Yet", NULL, share_window);
    data->WindowOwned = true;
    viewport->PlatformHandle = (void*)data->Window;
#ifdef _WIN32
    viewport->PlatformHandleRaw = glfwGetWin32Window(data->Window);
#endif
    glfwSetWindowPos(data->Window, (int)viewport->Pos.x, (int)viewport->Pos.y);

    // Install callbacks for secondary viewports
    glfwSetMouseButtonCallback(data->Window, ImGui_ImplGlfw_MouseButtonCallback);
    glfwSetScrollCallback(data->Window, ImGui_ImplGlfw_ScrollCallback);
    glfwSetKeyCallback(data->Window, ImGui_ImplGlfw_KeyCallback);
    glfwSetCharCallback(data->Window, ImGui_ImplGlfw_CharCallback);
    glfwSetWindowCloseCallback(data->Window, ImGui_ImplGlfw_WindowCloseCallback);
    glfwSetWindowPosCallback(data->Window, ImGui_ImplGlfw_WindowPosCallback);
    glfwSetWindowSizeCallback(data->Window, ImGui_ImplGlfw_WindowSizeCallback);
    if (g_ClientApi == GlfwClientApi_OpenGL)
    {
        glfwMakeContextCurrent(data->Window);
        glfwSwapInterval(0);
    }
}